

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.cpp
# Opt level: O0

void __thiscall
CaptureETCaptureRValueRight::CaptureETCaptureRValueRight(CaptureETCaptureRValueRight *this)

{
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  CaptureETCaptureRValueRight *local_10;
  CaptureETCaptureRValueRight *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"ETCaptureRValueRight",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Capture",&local_69);
  testinator::Test::Test(&this->super_Test,(string *)local_30,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CaptureETCaptureRValueRight_002c3bd8;
  return;
}

Assistant:

DEF_TEST(ETCaptureRValueRight, Capture)
{
  testinator::TestRegistry r;
  ostringstream oss;
  std::unique_ptr<testinator::Outputter> op =
    make_unique<testinator::DefaultOutputter>(oss);

  TestETCaptureRValueRight myTestA(r, "A");
  testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

  static string expected = "0 == 1";
  return oss.str().find(expected) != string::npos;
}